

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O3

void __thiscall
glcts::ViewportArray::ScissorAPI::getScissorBoxes
          (ScissorAPI *this,GLint max_viewports,vector<int,_std::allocator<int>_> *out_data)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  ulong uVar2;
  int iVar3;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  if (0 < max_viewports) {
    iVar3 = 0;
    uVar2 = 0;
    do {
      (**(code **)(CONCAT44(extraout_var,iVar1) + 0x860))
                (0xc10,uVar2 & 0xffffffff,
                 (out_data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start + iVar3);
      err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
      glu::checkError(err,"getIntegeri_v",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                      ,0x83e);
      uVar2 = uVar2 + 1;
      iVar3 = iVar3 + 4;
    } while ((uint)max_viewports != uVar2);
  }
  return;
}

Assistant:

void ScissorAPI::getScissorBoxes(GLint max_viewports, std::vector<GLint>& out_data)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	for (GLint i = 0; i < max_viewports; ++i)
	{
		gl.getIntegeri_v(GL_SCISSOR_BOX, i, &out_data[i * 4]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "getIntegeri_v");
	}
}